

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

bool Assimp::IFC::BoundingBoxesAdjacent(BoundingBox *bb,BoundingBox *ibb)

{
  double dVar1;
  float fVar2;
  bool local_22;
  bool local_21;
  IfcFloat epsilon;
  BoundingBox *ibb_local;
  BoundingBox *bb_local;
  
  fVar2 = Math::getEpsilon<float>();
  dVar1 = (double)fVar2;
  if (((((dVar1 <= ABS((bb->second).x - (ibb->first).x)) || ((ibb->second).y < (bb->first).y)) ||
       (local_21 = true, (bb->second).y < (ibb->first).y)) &&
      (((dVar1 <= ABS((bb->first).x - (ibb->second).x) || ((bb->second).y < (ibb->first).y)) ||
       (local_21 = true, (ibb->second).y < (bb->first).y)))) &&
     (((dVar1 <= ABS((bb->second).y - (ibb->first).y) || ((ibb->second).x < (bb->first).x)) ||
      (local_21 = true, (bb->second).x < (ibb->first).x)))) {
    local_22 = false;
    if ((ABS((bb->first).y - (ibb->second).y) < dVar1) &&
       (local_22 = false, (ibb->first).x <= (bb->second).x)) {
      local_22 = (bb->first).x <= (ibb->second).x;
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool BoundingBoxesAdjacent(const BoundingBox& bb, const BoundingBox& ibb)
{
    // TODO: I'm pretty sure there is a much more compact way to check this
    const IfcFloat epsilon = Math::getEpsilon<float>();
    return  (std::fabs(bb.second.x - ibb.first.x) < epsilon && bb.first.y <= ibb.second.y && bb.second.y >= ibb.first.y) ||
        (std::fabs(bb.first.x - ibb.second.x) < epsilon && ibb.first.y <= bb.second.y && ibb.second.y >= bb.first.y) ||
        (std::fabs(bb.second.y - ibb.first.y) < epsilon && bb.first.x <= ibb.second.x && bb.second.x >= ibb.first.x) ||
        (std::fabs(bb.first.y - ibb.second.y) < epsilon && ibb.first.x <= bb.second.x && ibb.second.x >= bb.first.x);
}